

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

void __thiscall ON_3dmAnnotationContext::Internal_Destroy(ON_3dmAnnotationContext *this)

{
  ON_3dmAnnotationContext *this_local;
  
  SetReferencedAnnotationSettings(this,(ON_3dmAnnotationSettings *)0x0);
  SetReferencedDimStyle(this,(ON_DimStyle *)0x0,(ON_DimStyle *)0x0,-0x7fffffff);
  this->m_view_context = Default.m_view_context;
  this->m_model_length_unit_system = Default.m_model_length_unit_system;
  this->m_page_length_unit_system = Default.m_page_length_unit_system;
  this->m_binary_archive = Default.m_binary_archive;
  return;
}

Assistant:

void ON_3dmAnnotationContext::Internal_Destroy()
{
  SetReferencedAnnotationSettings(nullptr);
  SetReferencedDimStyle(nullptr,nullptr,ON_UNSET_INT_INDEX);
  m_view_context = ON_3dmAnnotationContext::Default.m_view_context;
  m_model_length_unit_system = ON_3dmAnnotationContext::Default.m_model_length_unit_system;
  m_page_length_unit_system = ON_3dmAnnotationContext::Default.m_page_length_unit_system;
  m_binary_archive = ON_3dmAnnotationContext::Default.m_binary_archive;
}